

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char * get_ext(char *path,char *dest)

{
  char *pcVar1;
  char temp [260];
  char acStack_118 [264];
  
  if (dest != (char *)0x0) {
    pcVar1 = point_basename(path);
    strcpy(acStack_118,pcVar1);
    pcVar1 = strrchr(acStack_118,0x2e);
    memset(dest,0,0x104);
    if (pcVar1 != (char *)0x0) {
      strcpy(dest,pcVar1);
    }
  }
  return dest;
}

Assistant:

char *get_ext(const char *path, char *dest)
{
	if (dest == NULL)
	{
		return NULL;
	}
	char temp[MAX_PATH];
	strcpy(temp, point_basename(path));
	char *e = strrchr(temp, '.');
	clear_path_string(dest, MAX_PATH);
	if (e != NULL)
	{
		strcpy(dest, e);
	}
	return dest;
}